

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffghtb(fitsfile *fptr,int maxfield,long *naxis1,long *naxis2,int *tfields,char **ttype,
          long *tbcol,char **tform,char **tunit,char *extnm,int *status)

{
  int iVar1;
  int local_218;
  long local_210;
  LONGLONG pcount;
  LONGLONG llnaxis2;
  LONGLONG llnaxis1;
  char message [81];
  char local_198 [8];
  char xtension [71];
  char local_148 [8];
  char comm [73];
  char value [71];
  char local_a8 [8];
  char name [75];
  long fields;
  int tstatus;
  int nfound;
  int maxf;
  int ii;
  char **ttype_local;
  int *tfields_local;
  long *naxis2_local;
  long *naxis1_local;
  fitsfile *pfStack_18;
  int maxfield_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    _maxf = ttype;
    ttype_local = (char **)tfields;
    tfields_local = (int *)naxis2;
    naxis2_local = naxis1;
    naxis1_local._4_4_ = maxfield;
    pfStack_18 = fptr;
    ffgkyn(fptr,1,local_a8,comm + 0x48,local_148,status);
    iVar1 = strcmp(local_a8,"XTENSION");
    if (iVar1 == 0) {
      iVar1 = ffc2s(comm + 0x48,local_198,status);
      if (iVar1 < 1) {
        if ((comm[0x48] == '\'') && (iVar1 = strcmp(local_198,"TABLE"), iVar1 == 0)) {
          iVar1 = ffgttb(pfStack_18,&llnaxis2,&pcount,&local_210,(long *)(name + 0x48),status);
          if (iVar1 < 1) {
            if (naxis2_local != (long *)0x0) {
              *naxis2_local = llnaxis2;
            }
            if (tfields_local != (int *)0x0) {
              *(LONGLONG *)tfields_local = pcount;
            }
            if (local_210 == 0) {
              tstatus = (int)stack0xffffffffffffffa8;
              if (ttype_local != (char **)0x0) {
                *(int *)ttype_local = tstatus;
              }
              if (-1 < naxis1_local._4_4_) {
                local_218 = tstatus;
                if (naxis1_local._4_4_ < stack0xffffffffffffffa8) {
                  local_218 = naxis1_local._4_4_;
                }
                tstatus = local_218;
              }
              if (0 < tstatus) {
                for (nfound = 0; nfound < tstatus; nfound = nfound + 1) {
                  if (_maxf != (char **)0x0) {
                    *_maxf[nfound] = '\0';
                  }
                  if (tunit != (char **)0x0) {
                    *tunit[nfound] = '\0';
                  }
                }
                if (_maxf != (char **)0x0) {
                  ffgkns(pfStack_18,"TTYPE",1,tstatus,_maxf,(int *)((long)&fields + 4),status);
                }
                if (tunit != (char **)0x0) {
                  ffgkns(pfStack_18,"TUNIT",1,tstatus,tunit,(int *)((long)&fields + 4),status);
                }
                if (0 < *status) {
                  return *status;
                }
                if ((tbcol != (long *)0x0) &&
                   ((ffgknj(pfStack_18,"TBCOL",1,tstatus,tbcol,(int *)((long)&fields + 4),status),
                    0 < *status || (fields._4_4_ != tstatus)))) {
                  ffpmsg("Required TBCOL keyword(s) not found in ASCII table header (ffghtb).");
                  *status = 0xe7;
                  return 0xe7;
                }
                if ((tform != (char **)0x0) &&
                   ((ffgkns(pfStack_18,"TFORM",1,tstatus,tform,(int *)((long)&fields + 4),status),
                    0 < *status || (fields._4_4_ != tstatus)))) {
                  ffpmsg("Required TFORM keyword(s) not found in ASCII table header (ffghtb).");
                  *status = 0xe8;
                  return 0xe8;
                }
              }
              if (extnm != (char *)0x0) {
                *extnm = '\0';
                fields._0_4_ = *status;
                ffgkys(pfStack_18,"EXTNAME",extnm,local_148,status);
                if (*status == 0xca) {
                  *status = (int)fields;
                }
              }
              fptr_local._4_4_ = *status;
            }
            else {
              snprintf((char *)&llnaxis1,0x51,"PCOUNT = %.0f is illegal in ASCII table; must = 0",
                       (double)local_210);
              ffpmsg((char *)&llnaxis1);
              *status = 0xd6;
              fptr_local._4_4_ = 0xd6;
            }
          }
          else {
            fptr_local._4_4_ = *status;
          }
        }
        else {
          snprintf((char *)&llnaxis1,0x51,"This is not a TABLE extension: %s",comm + 0x48);
          ffpmsg((char *)&llnaxis1);
          *status = 0xe2;
          fptr_local._4_4_ = 0xe2;
        }
      }
      else {
        ffpmsg("Bad value string for XTENSION keyword:");
        ffpmsg(comm + 0x48);
        fptr_local._4_4_ = *status;
      }
    }
    else {
      snprintf((char *)&llnaxis1,0x51,"First keyword of the extension is not XTENSION: %s",local_a8)
      ;
      ffpmsg((char *)&llnaxis1);
      *status = 0xe1;
      fptr_local._4_4_ = 0xe1;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffghtb(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxfield,    /* I - maximum no. of columns to read;          */
           long *naxis1,    /* O - length of table row in bytes             */
           long *naxis2,    /* O - number of rows in the table              */
           int *tfields,    /* O - number of columns in the table           */
           char **ttype,    /* O - name of each column                      */
           long *tbcol,     /* O - byte offset in row to each column        */
           char **tform,    /* O - value of TFORMn keyword for each column  */
           char **tunit,    /* O - value of TUNITn keyword for each column  */
           char *extnm,   /* O - value of EXTNAME keyword, if any         */
           int *status)     /* IO - error status                            */
/*
  Get keywords from the Header of the ASCII TaBle:
  Check that the keywords conform to the FITS standard and return the
  parameters which describe the table.
*/
{
    int ii, maxf, nfound, tstatus;
    long fields;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char xtension[FLEN_VALUE], message[FLEN_ERRMSG];
    LONGLONG llnaxis1, llnaxis2, pcount;

    if (*status > 0)
        return(*status);

    /* read the first keyword of the extension */
    ffgkyn(fptr, 1, name, value, comm, status);

    if (!strcmp(name, "XTENSION"))
    {
            if (ffc2s(value, xtension, status) > 0)  /* get the value string */
            {
                ffpmsg("Bad value string for XTENSION keyword:");
                ffpmsg(value);
                return(*status);
            }

            /* allow the quoted string value to begin in any column and */
            /* allow any number of trailing blanks before the closing quote */
            if ( (value[0] != '\'')   ||  /* first char must be a quote */
                 ( strcmp(xtension, "TABLE") ) )
            {
                snprintf(message, FLEN_ERRMSG,
                "This is not a TABLE extension: %s", value);
                ffpmsg(message);
                return(*status = NOT_ATABLE);
            }
    }

    else  /* error: 1st keyword of extension != XTENSION */
    {
        snprintf(message, FLEN_ERRMSG,
        "First keyword of the extension is not XTENSION: %s", name);
        ffpmsg(message);
        return(*status = NO_XTENSION);
    }

    if (ffgttb(fptr, &llnaxis1, &llnaxis2, &pcount, &fields, status) > 0)
        return(*status);

    if (naxis1)
       *naxis1 = (long) llnaxis1;

    if (naxis2)
       *naxis2 = (long) llnaxis2;

    if (pcount != 0)
    {
       snprintf(message, FLEN_ERRMSG, "PCOUNT = %.0f is illegal in ASCII table; must = 0",
               (double) pcount);
       ffpmsg(message);
       return(*status = BAD_PCOUNT);
    }

    if (tfields)
       *tfields = fields;

    if (maxfield < 0)
        maxf = fields;
    else
        maxf = minvalue(maxfield, fields);

    if (maxf > 0)
    {
        for (ii = 0; ii < maxf; ii++)
        {   /* initialize optional keyword values */
            if (ttype)
                *ttype[ii] = '\0';   

            if (tunit)
                *tunit[ii] = '\0';
        }

   
        if (ttype)
            ffgkns(fptr, "TTYPE", 1, maxf, ttype, &nfound, status);

        if (tunit)
            ffgkns(fptr, "TUNIT", 1, maxf, tunit, &nfound, status);

        if (*status > 0)
            return(*status);

        if (tbcol)
        {
            ffgknj(fptr, "TBCOL", 1, maxf, tbcol, &nfound, status);

            if (*status > 0 || nfound != maxf)
            {
                ffpmsg(
        "Required TBCOL keyword(s) not found in ASCII table header (ffghtb).");
                return(*status = NO_TBCOL);
            }
        }

        if (tform)
        {
            ffgkns(fptr, "TFORM", 1, maxf, tform, &nfound, status);

            if (*status > 0 || nfound != maxf)
            {
                ffpmsg(
        "Required TFORM keyword(s) not found in ASCII table header (ffghtb).");
                return(*status = NO_TFORM);
            }
        }
    }

    if (extnm)
    {
        extnm[0] = '\0';

        tstatus = *status;
        ffgkys(fptr, "EXTNAME", extnm, comm, status);

        if (*status == KEY_NO_EXIST)
            *status = tstatus;  /* keyword not required, so ignore error */
    }

    return(*status);
}